

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr,int *pRc)

{
  sqlite3_vtab *psVar1;
  sqlite3_stmt *pStmt;
  Fts3PhraseToken *pFVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Mem *pMem;
  uchar *z;
  ulong iCol;
  Fts3DeferredToken *pFVar7;
  bool bVar8;
  int rc;
  int nToken;
  sqlite3_tokenizer_cursor *pTC;
  int iDum2;
  int iDum1;
  char *zToken;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  sqlite3_tokenizer_cursor *local_78;
  int local_70;
  int local_6c;
  int *local_68;
  long local_60;
  sqlite3_module *local_58;
  ulong local_50;
  Fts3Cursor *local_48;
  i64 local_40;
  char *local_38;
  
  local_84 = *pRc;
  uVar3 = 0;
  if (local_84 == 0) {
    iVar6 = 0;
    if (pCsr->pDeferred != (Fts3DeferredToken *)0x0) {
      local_84 = fts3CursorSeek((sqlite3_context *)0x0,pCsr);
      iVar6 = local_84;
      if ((local_84 == 0) && (local_88 = 0, iVar6 = 0, pCsr->pDeferred != (Fts3DeferredToken *)0x0))
      {
        psVar1 = (pCsr->base).pVtab;
        pStmt = pCsr->pStmt;
        local_58 = psVar1[3].pModule;
        local_60 = *(long *)&local_58->iVersion;
        iVar6 = 0;
        local_68 = pRc;
        pMem = columnMem(pStmt,0);
        local_40 = sqlite3VdbeIntValue(pMem);
        columnMallocFailure(pStmt);
        iVar4 = *(int *)&psVar1[2].pModule;
        if (0 < iVar4) {
          iVar6 = 0;
          iCol = 0;
          local_48 = pCsr;
          do {
            if (psVar1[2].zErrMsg[iCol] == '\0') {
              local_50 = iCol + 1;
              z = sqlite3_column_text(pCsr->pStmt,(int)local_50);
              local_78 = (sqlite3_tokenizer_cursor *)0x0;
              local_88 = sqlite3Fts3OpenTokenizer
                                   ((sqlite3_tokenizer *)local_58,pCsr->iLangid,(char *)z,-1,
                                    &local_78);
              iVar6 = local_88;
              while (iVar6 == 0) {
                local_7c = 0;
                local_6c = 0;
                local_70 = 0;
                local_80 = 0;
                local_88 = (**(code **)(local_60 + 0x28))
                                     (local_78,&local_38,&local_7c,&local_6c,&local_70,&local_80);
                pFVar7 = pCsr->pDeferred;
                iVar6 = local_88;
                pCsr = local_48;
                if ((pFVar7 != (Fts3DeferredToken *)0x0) && (local_88 == 0)) {
                  iVar6 = 0;
                  do {
                    iVar4 = local_80;
                    pFVar2 = pFVar7->pToken;
                    bVar8 = true;
                    if (((iCol == (uint)pFVar7->iCol) ||
                        (*(int *)&psVar1[2].pModule <= pFVar7->iCol)) &&
                       (local_80 == 0 || pFVar2->bFirst == 0)) {
                      iVar5 = pFVar2->n;
                      if (((iVar5 == local_7c) || ((iVar5 < local_7c && (pFVar2->isPrefix != 0))))
                         && (iVar5 = bcmp(local_38,pFVar2->z,(long)iVar5), iVar5 == 0)) {
                        fts3PendingListAppend(&pFVar7->pList,local_40,iCol,(long)iVar4,&local_88);
                        bVar8 = local_88 == 0;
                        iVar6 = local_88;
                      }
                    }
                    pFVar7 = pFVar7->pNext;
                    pCsr = local_48;
                  } while ((pFVar7 != (Fts3DeferredToken *)0x0) && (bVar8));
                }
              }
              if (local_78 != (sqlite3_tokenizer_cursor *)0x0) {
                (**(code **)(local_60 + 0x20))(local_78);
              }
              if (iVar6 == 0x65) {
                local_88 = 0;
                iVar6 = 0;
              }
              iVar4 = *(int *)&psVar1[2].pModule;
              bVar8 = iVar6 == 0;
              iCol = local_50;
            }
            else {
              bVar8 = true;
              iCol = iCol + 1;
            }
          } while ((bVar8) && ((long)iCol < (long)iVar4));
        }
        pRc = local_68;
        pFVar7 = pCsr->pDeferred;
        while ((pFVar7 != (Fts3DeferredToken *)0x0 && (iVar6 == 0))) {
          iVar6 = 0;
          if (pFVar7->pList != (PendingList *)0x0) {
            iVar6 = fts3PendingListAppendVarint(&pFVar7->pList,0);
          }
          pFVar7 = pFVar7->pNext;
        }
      }
    }
    local_84 = iVar6;
    iVar6 = fts3EvalTestExpr(pCsr,pCsr->pExpr,&local_84);
    for (pFVar7 = pCsr->pDeferred; pFVar7 != (Fts3DeferredToken *)0x0; pFVar7 = pFVar7->pNext) {
      sqlite3_free(pFVar7->pList);
      pFVar7->pList = (PendingList *)0x0;
    }
    *pRc = local_84;
    uVar3 = (uint)(iVar6 == 0 && local_84 == 0);
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr, int *pRc){
  int rc = *pRc;
  int bMiss = 0;
  if( rc==SQLITE_OK ){

    /* If there are one or more deferred tokens, load the current row into
    ** memory and scan it to determine the position list for each deferred
    ** token. Then, see if this row is really a match, considering deferred
    ** tokens and NEAR operators (neither of which were taken into account
    ** earlier, by fts3EvalNextRow()). 
    */
    if( pCsr->pDeferred ){
      rc = fts3CursorSeek(0, pCsr);
      if( rc==SQLITE_OK ){
        rc = sqlite3Fts3CacheDeferredDoclists(pCsr);
      }
    }
    bMiss = (0==fts3EvalTestExpr(pCsr, pCsr->pExpr, &rc));

    /* Free the position-lists accumulated for each deferred token above. */
    sqlite3Fts3FreeDeferredDoclists(pCsr);
    *pRc = rc;
  }
  return (rc==SQLITE_OK && bMiss);
}